

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_ext_key_share_parse_clienthello
               (SSL_HANDSHAKE *hs,bool *out_found,Span<const_unsigned_char> *out_peer_key,
               uint8_t *out_alert,SSL_CLIENT_HELLO *client_hello)

{
  uint16_t uVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  size_t sVar5;
  uint16_t id;
  uint8_t *local_78;
  Span<const_unsigned_char> *local_70;
  bool *local_68;
  CBS peer_key_tmp;
  CBS key_shares;
  CBS contents;
  
  bVar2 = ssl_client_hello_get_extension(client_hello,&contents,0x33);
  if (bVar2) {
    iVar3 = CBS_get_u16_length_prefixed(&contents,&key_shares);
    if ((iVar3 == 0) || (contents.len != 0)) {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x92f);
    }
    else {
      uVar1 = ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->group_id;
      puVar4 = (uchar *)0x0;
      sVar5 = 0;
      local_78 = out_alert;
      local_70 = out_peer_key;
      local_68 = out_found;
      do {
        if (key_shares.len == 0) {
          if (local_70 != (Span<const_unsigned_char> *)0x0) {
            local_70->data_ = puVar4;
            local_70->size_ = sVar5;
          }
          *local_68 = sVar5 != 0;
          return true;
        }
        iVar3 = CBS_get_u16(&key_shares,&id);
        if (((iVar3 == 0) ||
            (iVar3 = CBS_get_u16_length_prefixed(&key_shares,&peer_key_tmp), iVar3 == 0)) ||
           (peer_key_tmp.len == 0)) {
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x93d);
          return false;
        }
      } while ((id != uVar1) ||
              (bVar2 = sVar5 == 0, puVar4 = peer_key_tmp.data, sVar5 = peer_key_tmp.len, bVar2));
      ERR_put_error(0x10,0,0x108,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x943);
      *local_78 = '/';
    }
  }
  else {
    ERR_put_error(0x10,0,0x102,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x927);
    *out_alert = 'm';
  }
  return false;
}

Assistant:

bool ssl_ext_key_share_parse_clienthello(SSL_HANDSHAKE *hs, bool *out_found,
                                         Span<const uint8_t> *out_peer_key,
                                         uint8_t *out_alert,
                                         const SSL_CLIENT_HELLO *client_hello) {
  // We only support connections that include an ECDHE key exchange, or use a
  // PAKE.
  CBS contents;
  if (!ssl_client_hello_get_extension(client_hello, &contents,
                                      TLSEXT_TYPE_key_share)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_MISSING_KEY_SHARE);
    *out_alert = SSL_AD_MISSING_EXTENSION;
    return false;
  }

  CBS key_shares;
  if (!CBS_get_u16_length_prefixed(&contents, &key_shares) ||
      CBS_len(&contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  // Find the corresponding key share.
  const uint16_t group_id = hs->new_session->group_id;
  CBS peer_key;
  CBS_init(&peer_key, nullptr, 0);
  while (CBS_len(&key_shares) > 0) {
    uint16_t id;
    CBS peer_key_tmp;
    if (!CBS_get_u16(&key_shares, &id) ||
        !CBS_get_u16_length_prefixed(&key_shares, &peer_key_tmp) ||
        CBS_len(&peer_key_tmp) == 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }

    if (id == group_id) {
      if (CBS_len(&peer_key) != 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DUPLICATE_KEY_SHARE);
        *out_alert = SSL_AD_ILLEGAL_PARAMETER;
        return false;
      }

      peer_key = peer_key_tmp;
      // Continue parsing the structure to keep peers honest.
    }
  }

  if (out_peer_key != nullptr) {
    *out_peer_key = peer_key;
  }
  *out_found = CBS_len(&peer_key) != 0;
  return true;
}